

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrowTableFunction::ArrowScanBind
          (ArrowTableFunction *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  reference pvVar1;
  string *name;
  code *pcVar2;
  type pAVar3;
  DBConfig *config;
  pointer pAVar4;
  BinderException *this_00;
  InvalidInputException *this_01;
  allocator local_81;
  _Head_base<0UL,_duckdb::ArrowScanFunctionData_*,_false> local_80;
  shared_ptr<duckdb::DependencyItem,_true> dependency;
  stream_factory_produce_t stream_factory_produce;
  uintptr_t stream_factory_ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  if (pvVar1->is_null == false) {
    pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,1);
    if (pvVar1->is_null == false) {
      pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,2);
      if (pvVar1->is_null != true) {
        dependency.internal.super___shared_ptr<duckdb::DependencyItem,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        dependency.internal.super___shared_ptr<duckdb::DependencyItem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((input->ref->super_TableRef).external_dependency.internal.
            super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          name = (string *)
                 shared_ptr<duckdb::ExternalDependency,_true>::operator->
                           (&(input->ref->super_TableRef).external_dependency);
          ::std::__cxx11::string::string
                    ((string *)&local_50,"replacement_cache",(allocator *)&stream_factory_produce);
          ExternalDependency::GetDependency((ExternalDependency *)&stream_factory_ptr,name);
          shared_ptr<duckdb::DependencyItem,_true>::operator=
                    (&dependency,(shared_ptr<duckdb::DependencyItem,_true> *)&stream_factory_ptr);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
        stream_factory_ptr = Value::GetPointer(pvVar1);
        pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,1);
        stream_factory_produce = (stream_factory_produce_t)Value::GetPointer(pvVar1);
        pvVar1 = vector<duckdb::Value,_true>::get<true>(input->inputs,2);
        pcVar2 = (code *)Value::GetPointer(pvVar1);
        make_uniq<duckdb::ArrowScanFunctionData,duckdb::unique_ptr<duckdb::ArrowArrayStreamWrapper,std::default_delete<duckdb::ArrowArrayStreamWrapper>,true>(*&)(unsigned_long,duckdb::ArrowStreamParameters&),unsigned_long&,duckdb::shared_ptr<duckdb::DependencyItem,true>>
                  ((duckdb *)&local_80,
                   (_func_unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>,_true>_unsigned_long_ArrowStreamParameters_ptr
                    **)&stream_factory_produce,&stream_factory_ptr,&dependency);
        pAVar3 = unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                 ::operator*((unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                              *)&local_80);
        (*pcVar2)(stream_factory_ptr,&pAVar3->schema_root);
        config = DBConfig::GetConfig(context);
        pAVar4 = unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                 ::operator->((unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                               *)&local_80);
        PopulateArrowTableType(config,&pAVar4->arrow_table,&pAVar3->schema_root,names,return_types);
        QueryResult::DeduplicateColumns(names);
        pAVar4 = unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                 ::operator->((unique_ptr<duckdb::ArrowScanFunctionData,_std::default_delete<duckdb::ArrowScanFunctionData>,_true>
                               *)&local_80);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  (&(pAVar4->all_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &return_types->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        if ((return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          *(ArrowScanFunctionData **)this = local_80._M_head_impl;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&dependency.internal.
                      super___shared_ptr<duckdb::DependencyItem,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                 (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
        }
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Provided table/dataframe must have at least one column",
                   &local_81);
        InvalidInputException::InvalidInputException(this_01,(string *)&local_50);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"arrow_scan: pointers cannot be null",(allocator *)&dependency);
  BinderException::BinderException(this_00,&local_50);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> ArrowTableFunction::ArrowScanBind(ClientContext &context, TableFunctionBindInput &input,
                                                           vector<LogicalType> &return_types, vector<string> &names) {
	if (input.inputs[0].IsNull() || input.inputs[1].IsNull() || input.inputs[2].IsNull()) {
		throw BinderException("arrow_scan: pointers cannot be null");
	}
	auto &ref = input.ref;

	shared_ptr<DependencyItem> dependency;
	if (ref.external_dependency) {
		// This was created during the replacement scan for Python (see python_replacement_scan.cpp)
		// this object is the owning reference to 'stream_factory_ptr' and has to be kept alive.
		dependency = ref.external_dependency->GetDependency("replacement_cache");
		D_ASSERT(dependency);
	}

	auto stream_factory_ptr = input.inputs[0].GetPointer();
	auto stream_factory_produce = (stream_factory_produce_t)input.inputs[1].GetPointer();       // NOLINT
	auto stream_factory_get_schema = (stream_factory_get_schema_t)input.inputs[2].GetPointer(); // NOLINT

	auto res = make_uniq<ArrowScanFunctionData>(stream_factory_produce, stream_factory_ptr, std::move(dependency));

	auto &data = *res;
	stream_factory_get_schema(reinterpret_cast<ArrowArrayStream *>(stream_factory_ptr), data.schema_root.arrow_schema);
	PopulateArrowTableType(DBConfig::GetConfig(context), res->arrow_table, data.schema_root, names, return_types);
	QueryResult::DeduplicateColumns(names);
	res->all_types = return_types;
	if (return_types.empty()) {
		throw InvalidInputException("Provided table/dataframe must have at least one column");
	}
	return std::move(res);
}